

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall GlobOpt::NewInt64ConstantValue(GlobOpt *this,int64 intConst,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  ValueInfo *valueInfo;
  StackSym *sym;
  undefined4 *puVar3;
  int64 local_38;
  int64 intConst_local;
  Value *value;
  
  local_38 = intConst;
  valueInfo = (ValueInfo *)
              _IntConstantValueInfo<long,_Int64ConstantValueInfo,_(ValueStructureKind)2>::New
                        (this->alloc,intConst);
  intConst_local = (int64)NewValue(this,valueInfo);
  JsUtil::
  BaseDictionary<long,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<long,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<long,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this->int64ConstantToValueMap,&local_38,(Value **)&intConst_local);
  if ((*(long *)(*(long *)(intConst_local + 8) + 0x10) == 0) &&
     ((instr->m_opcode & ~ExtendedOpcodePrefix) == Ld_I4)) {
    sym = IR::Opnd::GetStackSym(instr->m_dst);
    if ((sym == (StackSym *)0x0) || ((sym->field_0x1a & 1) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x10d5,"(sym && !sym->IsTypeSpec())","sym && !sym->IsTypeSpec()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    GlobOptBlockData::SetValue
              (&this->currentBlock->globOptData,(Value *)intConst_local,&sym->super_Sym);
    BVSparse<Memory::JitArenaAllocator>::Set
              ((this->currentBlock->globOptData).liveVarSyms,(sym->super_Sym).m_id);
  }
  return (Value *)intConst_local;
}

Assistant:

Value *
GlobOpt::NewInt64ConstantValue(const int64 intConst, IR::Instr* instr)
{
    Value * value = NewValue(Int64ConstantValueInfo::New(this->alloc, intConst));
    this->int64ConstantToValueMap->Item(intConst, value);

    if (!value->GetValueInfo()->GetSymStore() &&
        (instr->m_opcode == Js::OpCode::LdC_A_I4 || instr->m_opcode == Js::OpCode::Ld_I4))
    {
        StackSym * sym = instr->GetDst()->GetStackSym();
        Assert(sym && !sym->IsTypeSpec());
        this->currentBlock->globOptData.SetValue(value, sym);
        this->currentBlock->globOptData.liveVarSyms->Set(sym->m_id);
    }
    return value;
}